

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

Box2i __thiscall Imf_3_3::TiledInputFile::dataWindowForLevel(TiledInputFile *this,int lx,int ly)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream *text;
  Vec2<int> extraout_RDX;
  Vec2<int> in_RDI;
  Box2i BVar4;
  exr_attr_box2i_t dw;
  stringstream _iex_throw_s;
  int32_t levh;
  int32_t levw;
  int32_t *in_stack_fffffffffffffde8;
  Vec2<int> *in_stack_fffffffffffffdf0;
  Vec2<int> *in_stack_fffffffffffffdf8;
  Box<Imath_3_1::Vec2<int>_> *in_stack_fffffffffffffe00;
  Vec2<int> ctxt;
  Vec2<int> local_1d4;
  Vec2<int> local_1cc;
  exr_attr_box2i_t local_1c4;
  stringstream local_1a8 [16];
  ostream local_198 [340];
  int in_stack_ffffffffffffffbc;
  Context *in_stack_ffffffffffffffc0;
  
  ctxt = in_RDI;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b795a);
  std::__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b796d);
  eVar1 = exr_get_level_sizes((exr_const_context_t)ctxt,
                              (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                              (int)in_stack_fffffffffffffe00,
                              (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                              &in_stack_fffffffffffffdf0->x,in_stack_fffffffffffffde8);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Error calling dataWindowForLevel() on image file \"");
    pcVar3 = fileName((TiledInputFile *)0x1b79da);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\".");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  std::__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b7a87);
  local_1c4 = Context::dataWindow(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Imath_3_1::Vec2<int>::Vec2(&local_1cc,local_1c4.min.x,local_1c4.min.y);
  Imath_3_1::Vec2<int>::Vec2(&local_1d4,local_1c4.min.x + -1,local_1c4.min.y + -1);
  Imath_3_1::Box<Imath_3_1::Vec2<int>_>::Box
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  BVar4.max = extraout_RDX;
  BVar4.min = in_RDI;
  return BVar4;
}

Assistant:

IMATH_NAMESPACE::Box2i
TiledInputFile::dataWindowForLevel (int lx, int ly) const
{
    int32_t levw = 0, levh = 0;
    if (EXR_ERR_SUCCESS != exr_get_level_sizes (
            _ctxt, _data->partNumber, lx, ly, &levw, &levh))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error calling dataWindowForLevel() on image "
            "file \""
                << fileName () << "\".");
    }
    exr_attr_box2i_t dw = _ctxt.dataWindow (_data->partNumber);
    return IMATH_NAMESPACE::Box2i (
        IMATH_NAMESPACE::V2i (dw.min.x, dw.min.y),
        IMATH_NAMESPACE::V2i (dw.min.x + levw - 1, dw.min.y + levh - 1));
}